

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampUnusedChannelCase::getIteration
          (IterationConfig *__return_storage_ptr__,TextureBorderClampUnusedChannelCase *this,int ndx
          )

{
  pointer pIVar1;
  pointer pcVar2;
  undefined8 uVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  float fVar6;
  int i;
  long lVar7;
  
  pIVar1 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->p0).m_data[0] = pIVar1[ndx].p0.m_data[0];
  (__return_storage_ptr__->p0).m_data[1] = pIVar1[ndx].p0.m_data[1];
  (__return_storage_ptr__->p1).m_data[0] = pIVar1[ndx].p1.m_data[0];
  (__return_storage_ptr__->p1).m_data[1] = pIVar1[ndx].p1.m_data[1];
  uVar3 = *(undefined8 *)((long)&pIVar1[ndx].borderColor.v + 8);
  *(undefined8 *)&(__return_storage_ptr__->borderColor).v =
       *(undefined8 *)&pIVar1[ndx].borderColor.v;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 8) = uVar3;
  lVar7 = 0;
  do {
    (__return_storage_ptr__->lookupScale).m_data[lVar7] = pIVar1[ndx].lookupScale.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    (__return_storage_ptr__->lookupBias).m_data[lVar7] = pIVar1[ndx].lookupBias.m_data[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  dVar4 = pIVar1[ndx].magFilter;
  __return_storage_ptr__->minFilter = pIVar1[ndx].minFilter;
  __return_storage_ptr__->magFilter = dVar4;
  (__return_storage_ptr__->description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->description).field_2;
  pcVar2 = pIVar1[ndx].description._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->description,pcVar2,
             pcVar2 + pIVar1[ndx].description._M_string_length);
  dVar4 = pIVar1[ndx].tWrapMode;
  dVar5 = pIVar1[ndx].compareMode;
  fVar6 = pIVar1[ndx].compareRef;
  __return_storage_ptr__->sWrapMode = pIVar1[ndx].sWrapMode;
  __return_storage_ptr__->tWrapMode = dVar4;
  __return_storage_ptr__->compareMode = dVar5;
  __return_storage_ptr__->compareRef = fVar6;
  return __return_storage_ptr__;
}

Assistant:

TextureBorderClampTest::IterationConfig TextureBorderClampUnusedChannelCase::getIteration (int ndx) const
{
	return m_iterations[ndx];
}